

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall
ON_PlaneSurface::CreatePlaneThroughBox
          (ON_PlaneSurface *this,ON_Plane *plane,ON_BoundingBox *bbox,double padding)

{
  undefined1 *this_00;
  double dVar1;
  ON_3dPoint p;
  double dVar2;
  ON_PlaneSurface *pOVar3;
  bool bVar4;
  double *pdVar5;
  long lVar6;
  uint index;
  ON_Plane *pOVar7;
  byte bVar8;
  double v;
  double u;
  ON_Interval vext;
  ON_Interval uext;
  double t;
  ON_Line edge;
  ON_3dPoint pt;
  double local_c8;
  double local_c0;
  ON_Interval local_b8;
  double local_a8;
  ON_Interval local_a0;
  ON_PlaneSurface *local_90;
  double local_88;
  double local_80;
  ON_Line local_78;
  ON_3dPoint local_48;
  
  bVar8 = 0;
  local_a8 = padding;
  bVar4 = ON_Plane::IsValid(plane);
  if (bVar4) {
    bVar4 = ON_BoundingBox::IsValid(bbox);
    dVar1 = ON_DBL_PINF;
    index = 0;
    if (bVar4) {
      local_88 = ON_DBL_NINF;
      local_90 = this;
      ON_Interval::ON_Interval(&local_a0,ON_DBL_PINF,ON_DBL_NINF);
      ON_Interval::ON_Interval(&local_b8,dVar1,local_88);
      do {
        ON_BoundingBox::Edge(&local_78,bbox,index);
        bVar4 = ON_Intersect(&local_78,&plane->plane_equation,&local_80);
        if (bVar4) {
          if ((0.0 <= local_80) && (local_80 <= 1.0)) {
            ON_Line::PointAt(&local_48,&local_78,local_80);
            p.y = local_48.y;
            p.x = local_48.x;
            p.z = local_48.z;
            ON_Plane::ClosestPointTo(plane,p,&local_c0,&local_c8);
            dVar1 = local_c0;
            pdVar5 = ON_Interval::operator[](&local_a0,0);
            dVar2 = local_c0;
            if (dVar1 < *pdVar5) {
              pdVar5 = ON_Interval::operator[](&local_a0,0);
              *pdVar5 = dVar2;
            }
            dVar1 = local_c0;
            pdVar5 = ON_Interval::operator[](&local_a0,1);
            dVar2 = local_c0;
            if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
              pdVar5 = ON_Interval::operator[](&local_a0,1);
              *pdVar5 = dVar2;
            }
            dVar1 = local_c8;
            pdVar5 = ON_Interval::operator[](&local_b8,0);
            dVar2 = local_c8;
            if (dVar1 < *pdVar5) {
              pdVar5 = ON_Interval::operator[](&local_b8,0);
              *pdVar5 = dVar2;
            }
            dVar1 = local_c8;
            pdVar5 = ON_Interval::operator[](&local_b8,1);
            dVar2 = local_c8;
            if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
              pdVar5 = ON_Interval::operator[](&local_b8,1);
              *pdVar5 = dVar2;
            }
          }
        }
        ON_Line::~ON_Line(&local_78);
        pOVar3 = local_90;
        index = index + 1;
      } while (index != 0xc);
      pOVar7 = &local_90->m_plane;
      for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pOVar7->origin).x = (plane->origin).x;
        plane = (ON_Plane *)((long)plane + (ulong)bVar8 * -0x10 + 8);
        pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
      }
      this_00 = &local_90->field_0x90;
      ON_Interval::Set((ON_Interval *)this_00,0.0,1.0);
      ON_Interval::Set((ON_Interval *)&pOVar3->field_0xa0,0.0,1.0);
      *(undefined8 *)&pOVar3->field_0xb0 = *(undefined8 *)&pOVar3->field_0x90;
      *(undefined8 *)&pOVar3->field_0xb8 = *(undefined8 *)&pOVar3->field_0x98;
      *(undefined8 *)&pOVar3->field_0xc0 = *(undefined8 *)&pOVar3->field_0xa0;
      *(undefined8 *)&pOVar3->field_0xc8 = *(undefined8 *)&pOVar3->field_0xa8;
      dVar1 = ON_Interval::Length(&local_a0);
      ON_Interval::Expand(&local_a0,dVar1 * local_a8 + local_a8);
      dVar1 = ON_Interval::Length(&local_b8);
      ON_Interval::Expand(&local_b8,dVar1 * local_a8 + local_a8);
      local_78.from.x = local_a0.m_t[0];
      local_78.from.y = local_a0.m_t[1];
      bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&local_78);
      if (bVar4) {
        *(double *)&pOVar3->field_0xb0 = local_78.from.x;
        *(double *)&pOVar3->field_0xb8 = local_78.from.y;
        *(double *)this_00 = local_78.from.x;
        *(double *)&pOVar3->field_0x98 = local_78.from.y;
      }
      local_78.from.x = local_b8.m_t[0];
      local_78.from.y = local_b8.m_t[1];
      bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&local_78);
      if (bVar4) {
        *(double *)&pOVar3->field_0xc0 = local_78.from.x;
        *(double *)&pOVar3->field_0xc8 = local_78.from.y;
        *(double *)&pOVar3->field_0xa0 = local_78.from.x;
        *(double *)&pOVar3->field_0xa8 = local_78.from.y;
      }
      index = 1;
    }
  }
  else {
    index = 0;
  }
  return SUB41(index,0);
}

Assistant:

bool ON_PlaneSurface::CreatePlaneThroughBox(
  const ON_Plane& plane,
  const ON_BoundingBox& bbox,
  double padding
)
{
  if (!plane.IsValid() || !bbox.IsValid())
    return false;

  ON_Interval uext(ON_DBL_PINF, ON_DBL_NINF);
  ON_Interval vext(ON_DBL_PINF, ON_DBL_NINF);
  double t, u, v;
  for (int i = 0; i < 12; i++)
  {
    ON_Line edge = bbox.Edge(i);
    if (!ON_Intersect(edge, plane.plane_equation, &t)) continue;
    if (t < 0.0 || t > 1.0) continue;
    ON_3dPoint pt = edge.PointAt(t);
    plane.ClosestPointTo(pt, &u, &v);
    if (u < uext[0]) uext[0] = u;
    if (u > uext[1]) uext[1] = u;
    if (v < vext[0]) vext[0] = v;
    if (v > vext[1]) vext[1] = v;
  }
  *this = plane;
  uext.Expand(padding * uext.Length() + padding);
  vext.Expand(padding * vext.Length() + padding);
  SetExtents(0, uext, true);
  SetExtents(1, vext, true);
  return true;
}